

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

var __thiscall cs::runtime_type::parse_div(runtime_type *this,var *a,var *b)

{
  bool bVar1;
  type_info *ptVar2;
  numeric *this_00;
  numeric *rhs;
  runtime_error *this_01;
  any *in_RCX;
  allocator local_39;
  string local_38;
  
  ptVar2 = cs_impl::any::type(b);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&numeric::typeinfo);
  if (bVar1) {
    ptVar2 = cs_impl::any::type(in_RCX);
    bVar1 = std::type_info::operator==(ptVar2,(type_info *)&numeric::typeinfo);
    if (bVar1) {
      this_00 = cs_impl::any::const_val<cs::numeric>(b);
      rhs = cs_impl::any::const_val<cs::numeric>(in_RCX);
      numeric::operator/((numeric *)&local_38,this_00,rhs);
      cs_impl::any::any<cs::numeric>((any *)this,(numeric *)&local_38);
      return (var)(proxy *)this;
    }
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_38,"Unsupported operator operations(Div).",&local_39);
  runtime_error::runtime_error(this_01,&local_38);
  __cxa_throw(this_01,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var runtime_type::parse_div(const var &a, const var &b)
	{
		if (a.type() == typeid(numeric) && b.type() == typeid(numeric))
			return a.const_val<numeric>() / b.const_val<numeric>();
		else
			throw runtime_error("Unsupported operator operations(Div).");
	}